

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O2

void __thiscall
chrono::copter::Copter<6>::AddVisualizationAssets
          (Copter<6> *this,string *chassismesh,string *propellermesh,ChFrame<double> *cor_m1,
          ChFrame<double> *cor_m2)

{
  element_type *peVar1;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_prop_shape;
  shared_ptr<chrono::ChBody> propeller;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> prop_trimesh;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&trimesh,SUB81(chassismesh,0),true);
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  peVar3 = trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  chrono::ChTriangleMeshShape::SetMesh(peVar3,&local_40,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  [9] = (element_type)0x0;
  propeller.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3ea3d70a3e4ccccd;
  propeller.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0x3ef5c28f;
  chrono::ChVisualShape::SetColor
            ((ChColor *)
             trimesh_shape.
             super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChTriangleMeshShape,void>
            (local_50,&trimesh_shape.
                       super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChPhysicsItem::AddVisualShape(peVar1,local_50,cor_m1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  p_Var2 = &((this->props).
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var4 = &((this->props).
                  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>; p_Var4 != p_Var2;
      p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&propeller.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&prop_trimesh,SUB81(propellermesh,0),true);
    chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
    peVar3 = trimesh_prop_shape.
             super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_60,
                 &prop_trimesh.
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                );
    chrono::ChTriangleMeshShape::SetMesh(peVar3,&local_60,1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    trimesh_prop_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr[9] = (element_type)0x0;
    chrono::ChVisualShape::SetColor
              ((ChColor *)
               trimesh_prop_shape.
               super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    peVar1 = propeller.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChTriangleMeshShape,void>
              (local_70,&trimesh_prop_shape.
                         super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
              );
    chrono::ChPhysicsItem::AddVisualShape(peVar1,local_70,cor_m2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trimesh_prop_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&prop_trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&propeller.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void Copter<nop>::AddVisualizationAssets(const std::string& chassismesh,
                                         const std::string& propellermesh,
                                         const ChFrame<>& cor_m1,
                                         const ChFrame<>& cor_m2) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(chassismesh, true, true);
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetMutable(false);
    trimesh_shape->SetColor(ChColor(0.2f, 0.32f, 0.48f));
    chassis->AddVisualShape(trimesh_shape, cor_m1);

    for (auto propeller : props) {
        auto prop_trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(propellermesh, true, true);
        auto trimesh_prop_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_prop_shape->SetMesh(prop_trimesh);
        trimesh_prop_shape->SetMutable(false);
        trimesh_prop_shape->SetColor(ChColor(0.8f, 0.68f, 0.52f));
        propeller->AddVisualShape(trimesh_prop_shape, cor_m2);
    }
}